

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::Init(CServerBrowser *this,CNetClient *pNetClient,char *pNetVersion)

{
  int iVar1;
  IConfigManager *pIVar2;
  undefined4 extraout_var;
  IOHANDLE pIVar3;
  IMasterServer *pIVar4;
  IMapChecker *pIVar5;
  CConfig *in_RSI;
  CNetClient *in_RDI;
  IConfigManager *pConfigManager;
  char *in_stack_ffffffffffffffa8;
  IKernel *in_stack_ffffffffffffffb0;
  CNode *pConfigManager_00;
  CServerBrowserFilter *this_00;
  CServerBrowserFavorites *in_stack_ffffffffffffffd0;
  
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar2 = IKernel::RequestInterface<IConfigManager>(in_stack_ffffffffffffffb0);
  iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[6])();
  *(ulong *)&(in_RDI->super_CNetBase).m_Socket.ipv6sock = CONCAT44(extraout_var,iVar1);
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar3 = (IOHANDLE)IKernel::RequestInterface<IConsole>(in_stack_ffffffffffffffb0);
  (in_RDI->super_CNetBase).m_DataLogSent = pIVar3;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar3 = (IOHANDLE)IKernel::RequestInterface<IStorage>(in_stack_ffffffffffffffb0);
  (in_RDI->super_CNetBase).m_DataLogRecv = pIVar3;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar4 = IKernel::RequestInterface<IMasterServer>(in_stack_ffffffffffffffb0);
  *(IMasterServer **)(in_RDI->super_CNetBase).m_Huffman.m_aNodes = pIVar4;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar5 = IKernel::RequestInterface<IMapChecker>(in_stack_ffffffffffffffb0);
  *(IMapChecker **)(in_RDI->super_CNetBase).m_Huffman.m_aNodes[0].m_aLeafs = pIVar5;
  *(CConfig **)&(in_RDI->super_CNetBase).m_Socket.type = in_RSI;
  pConfigManager_00 = (in_RDI->super_CNetBase).m_Huffman.m_aNodes + 1;
  this_00 = (CServerBrowserFilter *)(in_RDI->super_CNetBase).m_DataLogSent;
  IInterface::Kernel((IInterface *)in_RDI);
  IKernel::RequestInterface<IEngine>((IKernel *)pConfigManager_00);
  CServerBrowserFavorites::Init
            (in_stack_ffffffffffffffd0,in_RDI,(IConsole *)this_00,(IEngine *)in_RSI,
             (IConfigManager *)pConfigManager_00);
  Config((CServerBrowser *)in_RDI);
  IInterface::Kernel((IInterface *)in_RDI);
  IKernel::RequestInterface<IFriends>((IKernel *)pConfigManager_00);
  CServerBrowserFilter::Init(this_00,in_RSI,(IFriends *)pConfigManager_00,in_stack_ffffffffffffffa8)
  ;
  return;
}

Assistant:

void CServerBrowser::Init(class CNetClient *pNetClient, const char *pNetVersion)
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	m_pConfig = pConfigManager->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pMasterServer = Kernel()->RequestInterface<IMasterServer>();
	m_pMapChecker = Kernel()->RequestInterface<IMapChecker>();
	m_pNetClient = pNetClient;

	m_ServerBrowserFavorites.Init(pNetClient, m_pConsole, Kernel()->RequestInterface<IEngine>(), pConfigManager);
	m_ServerBrowserFilter.Init(Config(), Kernel()->RequestInterface<IFriends>(), pNetVersion);
}